

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::ProgramInputOutputReferencedByCase::init
          (ProgramInputOutputReferencedByCase *this,EVP_PKEY_CTX *ctx)

{
  pointer pcVar1;
  pointer pcVar2;
  CaseType CVar3;
  Storage SVar4;
  Storage storage_;
  ShaderType type;
  bool bVar5;
  bool bVar6;
  ContextType CVar7;
  GLSLVersion GVar8;
  int extraout_EAX;
  Program *this_00;
  Shader *pSVar9;
  Shader *pSVar10;
  undefined7 extraout_var;
  NotSupportedError *pNVar11;
  string *this_01;
  char *pcVar12;
  char *__end;
  VariableDeclaration targetDecl;
  VariableDeclaration targetDeclArr;
  string local_140;
  VarType local_120;
  undefined1 local_108 [64];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [32];
  VarType local_88;
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  GLSLVersion local_48;
  Layout local_44;
  
  CVar3 = this->m_caseType;
  CVar7.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(CVar7,(ApiType)0x23);
  if ((((CVar3 < CASE_LAST) && ((0x73U >> ((byte)CVar3 & 0x1f) & 1) == 0)) && (!bVar5)) &&
     (bVar6 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_EXT_tessellation_shader"), !bVar6)) {
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"Test requires GL_EXT_tessellation_shader extension","");
    tcu::NotSupportedError::NotSupportedError(pNVar11,(string *)local_108);
    __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (((CVar3 < CASE_SEPARABLE_TESS_CTRL && (0x35U >> ((byte)CVar3 & 0x1f) & 1) == 0) && !bVar5) &&
     (bVar5 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader")
     , !bVar5)) {
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"Test requires GL_EXT_geometry_shader extension","");
    tcu::NotSupportedError::NotSupportedError(pNVar11,(string *)local_108);
    __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  CVar7.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  GVar8 = glu::getContextTypeGLSLVersion(CVar7);
  this_00 = (Program *)operator_new(0x48);
  ProgramInterfaceDefinition::Program::Program(this_00);
  this->m_program = this_00;
  if (this->m_caseType - CASE_SEPARABLE_VERTEX < 5) {
    SVar4 = this->m_targetStorage;
    pcVar12 = "shaderOutput";
    if (SVar4 == STORAGE_PATCH_IN || SVar4 == STORAGE_IN) {
      pcVar12 = "shaderInput";
    }
    local_48 = GVar8;
    glu::VarType::VarType((VarType *)&local_140,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,pcVar12,
               pcVar12 + (0xc - (ulong)(SVar4 == STORAGE_PATCH_IN || SVar4 == STORAGE_IN)));
    storage_ = this->m_targetStorage;
    glu::Layout::Layout((Layout *)&local_120,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              ((VariableDeclaration *)local_108,(VarType *)&local_140,(string *)local_a8,storage_,
               INTERPOLATION_LAST,(Layout *)&local_120,0);
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    glu::VarType::~VarType((VarType *)&local_140);
    CVar3 = this->m_caseType;
    type = (CVar3 != CASE_SEPARABLE_TESS_EVAL) + 4 + (uint)(CVar3 != CASE_SEPARABLE_TESS_EVAL);
    if (CVar3 - SHADERTYPE_TESSELLATION_EVALUATION < SHADERTYPE_TESSELLATION_EVALUATION) {
      type = CVar3 - SHADERTYPE_TESSELLATION_EVALUATION;
    }
    if ((SVar4 == STORAGE_PATCH_IN) || (SVar4 == STORAGE_IN)) {
      bVar5 = (type & SHADERTYPE_LAST) == SHADERTYPE_GEOMETRY || CVar3 == CASE_SEPARABLE_TESS_EVAL;
    }
    else {
      bVar5 = type == SHADERTYPE_TESSELLATION_CONTROL;
    }
    ProgramInterfaceDefinition::Program::setSeparable(this->m_program,true);
    if ((bool)(bVar5 & SVar4 - STORAGE_LAST < 0xfffffffe)) {
      glu::VarType::VarType(&local_120,(VarType *)(local_108 + 0x20),-1);
      GVar8 = local_48;
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,pcVar12,
                 pcVar12 + (0xc - (ulong)(SVar4 == STORAGE_PATCH_IN || SVar4 == STORAGE_IN)));
      SVar4 = this->m_targetStorage;
      glu::Layout::Layout(&local_44,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                ((VariableDeclaration *)local_a8,&local_120,&local_140,SVar4,INTERPOLATION_LAST,
                 &local_44,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType(&local_120);
      pSVar10 = ProgramInterfaceDefinition::Program::addShader(this->m_program,type,GVar8);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
                (&(pSVar10->m_defaultBlock).variables,(value_type *)local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_p != &local_58) {
        operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType(&local_88);
    }
    else {
      pSVar10 = ProgramInterfaceDefinition::Program::addShader(this->m_program,type,local_48);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
                (&(pSVar10->m_defaultBlock).variables,(value_type *)local_108);
    }
    if (local_c8._M_p != local_108 + 0x50) {
      operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
    }
    this_01 = (string *)(local_108 + 0x20);
  }
  else {
    if (CASE_VERTEX_TESS_GEO_FRAGMENT < this->m_caseType) goto LAB_00548cf3;
    pSVar10 = ProgramInterfaceDefinition::Program::addShader(this_00,SHADERTYPE_VERTEX,GVar8);
    pSVar9 = ProgramInterfaceDefinition::Program::addShader
                       (this->m_program,SHADERTYPE_FRAGMENT,GVar8);
    ProgramInterfaceDefinition::Program::setSeparable(this->m_program,false);
    glu::VarType::VarType((VarType *)&local_140,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    pcVar1 = local_a8 + 0x10;
    local_a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"shaderInput","");
    glu::Layout::Layout((Layout *)&local_120,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              ((VariableDeclaration *)local_108,(VarType *)&local_140,(string *)local_a8,STORAGE_IN,
               INTERPOLATION_LAST,(Layout *)&local_120,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>
              (&(pSVar10->m_defaultBlock).variables,(VariableDeclaration *)local_108);
    pcVar2 = local_108 + 0x50;
    if (local_c8._M_p != pcVar2) {
      operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
    }
    glu::VarType::~VarType((VarType *)(local_108 + 0x20));
    if ((pointer)local_a8._0_8_ != pcVar1) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    glu::VarType::~VarType((VarType *)&local_140);
    glu::VarType::VarType((VarType *)&local_140,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    local_a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"shaderOutput","");
    glu::Layout::Layout((Layout *)&local_120,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              ((VariableDeclaration *)local_108,(VarType *)&local_140,(string *)local_a8,STORAGE_OUT
               ,INTERPOLATION_LAST,(Layout *)&local_120,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>
              (&(pSVar10->m_defaultBlock).variables,(VariableDeclaration *)local_108);
    if (local_c8._M_p != pcVar2) {
      operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
    }
    glu::VarType::~VarType((VarType *)(local_108 + 0x20));
    if ((pointer)local_a8._0_8_ != pcVar1) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    glu::VarType::~VarType((VarType *)&local_140);
    glu::VarType::VarType((VarType *)&local_140,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    local_a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"shaderOutput","");
    glu::Layout::Layout((Layout *)&local_120,0,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              ((VariableDeclaration *)local_108,(VarType *)&local_140,(string *)local_a8,STORAGE_OUT
               ,INTERPOLATION_LAST,(Layout *)&local_120,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>
              (&(pSVar9->m_defaultBlock).variables,(VariableDeclaration *)local_108);
    if (local_c8._M_p != pcVar2) {
      operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
    }
    glu::VarType::~VarType((VarType *)(local_108 + 0x20));
    if ((pointer)local_a8._0_8_ != pcVar1) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    glu::VarType::~VarType((VarType *)&local_140);
    glu::VarType::VarType((VarType *)&local_140,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    local_a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"shaderInput","");
    glu::Layout::Layout((Layout *)&local_120,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              ((VariableDeclaration *)local_108,(VarType *)&local_140,(string *)local_a8,STORAGE_IN,
               INTERPOLATION_LAST,(Layout *)&local_120,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>
              (&(pSVar9->m_defaultBlock).variables,(VariableDeclaration *)local_108);
    if (local_c8._M_p != pcVar2) {
      operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
    }
    glu::VarType::~VarType((VarType *)(local_108 + 0x20));
    if ((pointer)local_a8._0_8_ != pcVar1) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    glu::VarType::~VarType((VarType *)&local_140);
    if ((this->m_caseType & ~CASE_VERTEX_GEO_FRAGMENT) == CASE_VERTEX_TESS_FRAGMENT) {
      pSVar10 = ProgramInterfaceDefinition::Program::addShader
                          (this->m_program,SHADERTYPE_TESSELLATION_CONTROL,GVar8);
      pSVar9 = ProgramInterfaceDefinition::Program::addShader
                         (this->m_program,SHADERTYPE_TESSELLATION_EVALUATION,GVar8);
      glu::VarType::VarType(&local_120,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      glu::VarType::VarType((VarType *)&local_140,&local_120,-1);
      local_a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"shaderInput","");
      glu::Layout::Layout(&local_44,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                ((VariableDeclaration *)local_108,(VarType *)&local_140,(string *)local_a8,
                 STORAGE_IN,INTERPOLATION_LAST,&local_44,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
      emplace_back<glu::VariableDeclaration>
                (&(pSVar10->m_defaultBlock).variables,(VariableDeclaration *)local_108);
      if (local_c8._M_p != local_108 + 0x50) {
        operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType((VarType *)(local_108 + 0x20));
      if ((pointer)local_a8._0_8_ != pcVar1) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      glu::VarType::~VarType((VarType *)&local_140);
      glu::VarType::~VarType(&local_120);
      glu::VarType::VarType(&local_120,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      glu::VarType::VarType((VarType *)&local_140,&local_120,-1);
      local_a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"shaderOutput","");
      glu::Layout::Layout(&local_44,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      pcVar2 = local_108 + 0x50;
      glu::VariableDeclaration::VariableDeclaration
                ((VariableDeclaration *)local_108,(VarType *)&local_140,(string *)local_a8,
                 STORAGE_OUT,INTERPOLATION_LAST,&local_44,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
      emplace_back<glu::VariableDeclaration>
                (&(pSVar10->m_defaultBlock).variables,(VariableDeclaration *)local_108);
      if (local_c8._M_p != pcVar2) {
        operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType((VarType *)(local_108 + 0x20));
      if ((pointer)local_a8._0_8_ != pcVar1) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      glu::VarType::~VarType((VarType *)&local_140);
      glu::VarType::~VarType(&local_120);
      glu::VarType::VarType(&local_120,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      glu::VarType::VarType((VarType *)&local_140,&local_120,-1);
      local_a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"shaderInput","");
      glu::Layout::Layout(&local_44,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                ((VariableDeclaration *)local_108,(VarType *)&local_140,(string *)local_a8,
                 STORAGE_IN,INTERPOLATION_LAST,&local_44,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
      emplace_back<glu::VariableDeclaration>
                (&(pSVar9->m_defaultBlock).variables,(VariableDeclaration *)local_108);
      if (local_c8._M_p != pcVar2) {
        operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType((VarType *)(local_108 + 0x20));
      if ((pointer)local_a8._0_8_ != pcVar1) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      glu::VarType::~VarType((VarType *)&local_140);
      glu::VarType::~VarType(&local_120);
      glu::VarType::VarType((VarType *)&local_140,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      local_a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"shaderOutput","");
      glu::Layout::Layout((Layout *)&local_120,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                ((VariableDeclaration *)local_108,(VarType *)&local_140,(string *)local_a8,
                 STORAGE_OUT,INTERPOLATION_LAST,(Layout *)&local_120,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
      emplace_back<glu::VariableDeclaration>
                (&(pSVar9->m_defaultBlock).variables,(VariableDeclaration *)local_108);
      if (local_c8._M_p != pcVar2) {
        operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType((VarType *)(local_108 + 0x20));
      if ((pointer)local_a8._0_8_ != pcVar1) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      glu::VarType::~VarType((VarType *)&local_140);
    }
    if ((this->m_caseType | CASE_VERTEX_TESS_FRAGMENT) != CASE_VERTEX_TESS_GEO_FRAGMENT)
    goto LAB_00548cf3;
    pSVar10 = ProgramInterfaceDefinition::Program::addShader
                        (this->m_program,SHADERTYPE_GEOMETRY,GVar8);
    glu::VarType::VarType(&local_120,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    glu::VarType::VarType((VarType *)&local_140,&local_120,-1);
    local_a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"shaderInput","");
    glu::Layout::Layout(&local_44,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              ((VariableDeclaration *)local_108,(VarType *)&local_140,(string *)local_a8,STORAGE_IN,
               INTERPOLATION_LAST,&local_44,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>
              (&(pSVar10->m_defaultBlock).variables,(VariableDeclaration *)local_108);
    if (local_c8._M_p != local_108 + 0x50) {
      operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
    }
    glu::VarType::~VarType((VarType *)(local_108 + 0x20));
    if ((pointer)local_a8._0_8_ != pcVar1) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    glu::VarType::~VarType((VarType *)&local_140);
    glu::VarType::~VarType(&local_120);
    glu::VarType::VarType((VarType *)&local_140,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    local_a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"shaderOutput","");
    glu::Layout::Layout((Layout *)&local_120,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              ((VariableDeclaration *)local_108,(VarType *)&local_140,(string *)local_a8,STORAGE_OUT
               ,INTERPOLATION_LAST,(Layout *)&local_120,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>
              (&(pSVar10->m_defaultBlock).variables,(VariableDeclaration *)local_108);
    if (local_c8._M_p != local_108 + 0x50) {
      operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
    }
    glu::VarType::~VarType((VarType *)(local_108 + 0x20));
    if ((pointer)local_a8._0_8_ != pcVar1) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    this_01 = &local_140;
  }
  glu::VarType::~VarType((VarType *)this_01);
LAB_00548cf3:
  bVar5 = ProgramInterfaceDefinition::Program::hasStage(this->m_program,SHADERTYPE_GEOMETRY);
  if (bVar5) {
    ProgramInterfaceDefinition::Program::setGeometryNumOutputVertices(this->m_program,1);
  }
  bVar5 = ProgramInterfaceDefinition::Program::hasStage
                    (this->m_program,SHADERTYPE_TESSELLATION_CONTROL);
  if (!bVar5) {
    bVar5 = ProgramInterfaceDefinition::Program::hasStage
                      (this->m_program,SHADERTYPE_TESSELLATION_EVALUATION);
    if (!bVar5) {
      return (int)CONCAT71(extraout_var,bVar5);
    }
  }
  ProgramInterfaceDefinition::Program::setTessellationNumOutputPatchVertices(this->m_program,1);
  return extraout_EAX;
}

Assistant:

void ProgramInputOutputReferencedByCase::init (void)
{
	const bool hasTessellationShader =	(m_caseType == CASE_VERTEX_TESS_FRAGMENT)		||
										(m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)	||
										(m_caseType == CASE_SEPARABLE_TESS_CTRL)		||
										(m_caseType == CASE_SEPARABLE_TESS_EVAL);
	const bool hasGeometryShader =		(m_caseType == CASE_VERTEX_GEO_FRAGMENT)		||
										(m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)	||
										(m_caseType == CASE_SEPARABLE_GEOMETRY);
	const bool supportsES32 =			glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (hasTessellationShader && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");
	if (hasGeometryShader && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_geometry_shader extension");

	glu::GLSLVersion glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
	m_program = new ProgramInterfaceDefinition::Program();

	if (m_caseType == CASE_SEPARABLE_VERTEX		||
		m_caseType == CASE_SEPARABLE_FRAGMENT	||
		m_caseType == CASE_SEPARABLE_GEOMETRY	||
		m_caseType == CASE_SEPARABLE_TESS_CTRL	||
		m_caseType == CASE_SEPARABLE_TESS_EVAL)
	{
		const bool						isInputCase			= (m_targetStorage == glu::STORAGE_IN || m_targetStorage == glu::STORAGE_PATCH_IN);
		const bool						perPatchStorage		= (m_targetStorage == glu::STORAGE_PATCH_IN || m_targetStorage == glu::STORAGE_PATCH_OUT);
		const char*						varName				= (isInputCase) ? ("shaderInput") : ("shaderOutput");
		const glu::VariableDeclaration	targetDecl			(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), varName, m_targetStorage);
		const glu::ShaderType			shaderType			= (m_caseType == CASE_SEPARABLE_VERTEX)		? (glu::SHADERTYPE_VERTEX)
															: (m_caseType == CASE_SEPARABLE_FRAGMENT)	? (glu::SHADERTYPE_FRAGMENT)
															: (m_caseType == CASE_SEPARABLE_GEOMETRY)	? (glu::SHADERTYPE_GEOMETRY)
															: (m_caseType == CASE_SEPARABLE_TESS_CTRL)	? (glu::SHADERTYPE_TESSELLATION_CONTROL)
															: (m_caseType == CASE_SEPARABLE_TESS_EVAL)	? (glu::SHADERTYPE_TESSELLATION_EVALUATION)
															:											  (glu::SHADERTYPE_LAST);
		const bool						arrayedInterface	= (isInputCase) ? ((shaderType == glu::SHADERTYPE_GEOMETRY)					||
																			   (shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)		||
																			   (shaderType == glu::SHADERTYPE_TESSELLATION_EVALUATION))
																			: (shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL);

		m_program->setSeparable(true);

		if (arrayedInterface && !perPatchStorage)
		{
			const glu::VariableDeclaration targetDeclArr(glu::VarType(targetDecl.varType, glu::VarType::UNSIZED_ARRAY), varName, m_targetStorage);
			m_program->addShader(shaderType, glslVersion)->getDefaultBlock().variables.push_back(targetDeclArr);
		}
		else
		{
			m_program->addShader(shaderType, glslVersion)->getDefaultBlock().variables.push_back(targetDecl);
		}
	}
	else if (m_caseType == CASE_VERTEX_FRAGMENT			||
			 m_caseType == CASE_VERTEX_GEO_FRAGMENT		||
			 m_caseType == CASE_VERTEX_TESS_FRAGMENT	||
			 m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)
	{
		ProgramInterfaceDefinition::Shader*	vertex		= m_program->addShader(glu::SHADERTYPE_VERTEX, glslVersion);
		ProgramInterfaceDefinition::Shader*	fragment	= m_program->addShader(glu::SHADERTYPE_FRAGMENT, glslVersion);

		m_program->setSeparable(false);

		vertex->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																			   "shaderInput",
																			   glu::STORAGE_IN));
		vertex->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																			   "shaderOutput",
																			   glu::STORAGE_OUT,
																			   glu::INTERPOLATION_LAST,
																			   glu::Layout(1)));

		fragment->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																				 "shaderOutput",
																				 glu::STORAGE_OUT,
																				 glu::INTERPOLATION_LAST,
																				 glu::Layout(0)));
		fragment->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																				 "shaderInput",
																				 glu::STORAGE_IN,
																				 glu::INTERPOLATION_LAST,
																				 glu::Layout(1)));

		if (m_caseType == CASE_VERTEX_TESS_FRAGMENT || m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)
		{
			ProgramInterfaceDefinition::Shader* tessCtrl = m_program->addShader(glu::SHADERTYPE_TESSELLATION_CONTROL, glslVersion);
			ProgramInterfaceDefinition::Shader* tessEval = m_program->addShader(glu::SHADERTYPE_TESSELLATION_EVALUATION, glslVersion);

			tessCtrl->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY),
																					 "shaderInput",
																					 glu::STORAGE_IN,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));
			tessCtrl->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY),
																					 "shaderOutput",
																					 glu::STORAGE_OUT,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));

			tessEval->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY),
																					 "shaderInput",
																					 glu::STORAGE_IN,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));
			tessEval->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																					 "shaderOutput",
																					 glu::STORAGE_OUT,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));
		}

		if (m_caseType == CASE_VERTEX_GEO_FRAGMENT || m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)
		{
			ProgramInterfaceDefinition::Shader* geometry = m_program->addShader(glu::SHADERTYPE_GEOMETRY, glslVersion);

			geometry->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY),
																					 "shaderInput",
																					 glu::STORAGE_IN,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));
			geometry->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																					 "shaderOutput",
																					 glu::STORAGE_OUT,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));
		}
	}
	else
		DE_ASSERT(false);

	if (m_program->hasStage(glu::SHADERTYPE_GEOMETRY))
		m_program->setGeometryNumOutputVertices(1);
	if (m_program->hasStage(glu::SHADERTYPE_TESSELLATION_CONTROL) || m_program->hasStage(glu::SHADERTYPE_TESSELLATION_EVALUATION))
		m_program->setTessellationNumOutputPatchVertices(1);

	DE_ASSERT(m_program->isValid());
}